

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

size_t SaveMultiChannelEXRToMemory(EXRImage *exrImage,uchar **memory_out,char **err)

{
  undefined4 uVar1;
  undefined4 uVar2;
  value_type vVar3;
  undefined2 uVar4;
  undefined4 uVar5;
  uint uVar6;
  pointer __position;
  int iVar7;
  int iVar8;
  FP32 FVar9;
  long lVar10;
  size_t sVar11;
  reference pvVar12;
  mz_ulong mVar13;
  reference pvVar14;
  reference pvVar15;
  value_type *pvVar16;
  int *piVar17;
  reference __first;
  reference pvVar18;
  uchar *__dest;
  value_type vVar19;
  uint uVar20;
  pointer puVar21;
  ushort uVar22;
  ulong uVar23;
  int y;
  int iVar24;
  FP16 h;
  int iVar25;
  long lVar26;
  uchar **data_00;
  size_type __n;
  size_t __n_00;
  int iVar27;
  reference pvVar28;
  uint uVar29;
  uint uVar30;
  unsigned_long uVar31;
  ulong uVar32;
  uint uVar33;
  pointer pvVar34;
  int iVar35;
  pointer pvVar36;
  int x_4;
  int x;
  long lVar37;
  reference pvVar38;
  ulong uVar39;
  bool bVar40;
  int local_184;
  int local_178;
  vector<unsigned_char,_std::allocator<unsigned_char>_> memory;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  char header [4];
  char acStack_124 [4];
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  int local_108;
  uchar local_104;
  undefined8 local_100;
  mz_ulong local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  dataList;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channelOffsetList;
  vector<long_long,_std::allocator<long_long>_> offsets;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  
  if (exrImage == (EXRImage *)0x0 || memory_out == (uchar **)0x0) {
    __n_00 = 0xffffffffffffffff;
    if (err != (char **)0x0) {
      *err = "Invalid argument.";
    }
  }
  else {
    memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    builtin_strncpy(header,"v/1\x01",4);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&memory,(const_iterator)0x0,
               header,acStack_124);
    header[0] = '\x02';
    header[1] = '\0';
    header[2] = '\0';
    header[3] = '\0';
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&memory,
               (const_iterator)
               memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,header,acStack_124);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dataList.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dataList.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dataList.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (lVar26 = 0;
        pvVar36 = dataList.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, lVar26 < exrImage->num_channels;
        lVar26 = lVar26 + 1) {
      _header = (uchar *)&local_118;
      local_120._M_current = (uchar *)0x0;
      local_118._M_local_buf[0] = '\0';
      local_104 = '\0';
      local_108 = exrImage->requested_pixel_types[lVar26];
      local_100._0_4_ = 1;
      local_100._4_4_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&offsets,exrImage->channel_names[lVar26],
                 (allocator<char> *)&channelOffsetList);
      std::__cxx11::string::operator=((string *)header,(string *)&offsets);
      std::__cxx11::string::~string((string *)&offsets);
      std::
      vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ::push_back((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                   *)&dataList,(value_type *)header);
      std::__cxx11::string::~string((string *)header);
    }
    lVar10 = ((long)dataList.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)dataList.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x30;
    lVar37 = 0;
    pvVar34 = dataList.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar26 = lVar10;
    while (bVar40 = lVar26 != 0, lVar26 = lVar26 + -1, bVar40) {
      sVar11 = strlen((char *)(pvVar34->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start);
      lVar37 = lVar37 + sVar11 + 0x11;
      pvVar34 = pvVar34 + 2;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&data,lVar37 + 1);
    pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&data,0);
    while (bVar40 = lVar10 != 0, lVar10 = lVar10 + -1, bVar40) {
      puVar21 = (pvVar36->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_start;
      sVar11 = strlen((char *)puVar21);
      memcpy(pvVar12,puVar21,sVar11);
      sVar11 = strlen((char *)(pvVar36->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start);
      pvVar38 = pvVar12 + sVar11;
      pvVar12 = pvVar38 + 0x11;
      *pvVar38 = '\0';
      puVar21 = pvVar36[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage;
      *(undefined4 *)(pvVar38 + 1) =
           *(undefined4 *)
            &pvVar36[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
      pvVar38[5] = *(value_type *)
                    ((long)&pvVar36[1].
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish + 4);
      *(pointer *)(pvVar38 + 9) = puVar21;
      pvVar36 = pvVar36 + 2;
    }
    *pvVar12 = '\0';
    pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&data,0);
    anon_unknown.dwarf_4eb0f::WriteAttributeToMemory
              (&memory,"channels","chlist",pvVar12,
               (int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
               (int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::~vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
               *)&dataList);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    header[0] = '\x03';
    header[1] = '\0';
    header[2] = '\0';
    header[3] = '\0';
    anon_unknown.dwarf_4eb0f::WriteAttributeToMemory
              (&memory,"compression","compression",(uchar *)header,1);
    _header = (uchar *)0x0;
    uVar1 = exrImage->width;
    uVar2 = exrImage->height;
    local_120._M_current = (uchar *)CONCAT44(uVar2 + -1,uVar1 + -1);
    anon_unknown.dwarf_4eb0f::WriteAttributeToMemory
              (&memory,"dataWindow","box2i",(uchar *)header,0x10);
    iVar35 = 0x10;
    anon_unknown.dwarf_4eb0f::WriteAttributeToMemory
              (&memory,"displayWindow","box2i",(uchar *)header,0x10);
    _header = _header & 0xffffffffffffff00;
    anon_unknown.dwarf_4eb0f::WriteAttributeToMemory
              (&memory,"lineOrder","lineOrder",(uchar *)header,1);
    header[0] = '\0';
    header[1] = '\0';
    header[2] = -0x80;
    header[3] = '?';
    anon_unknown.dwarf_4eb0f::WriteAttributeToMemory
              (&memory,"pixelAspectRatio","float",(uchar *)header,4);
    _header = (uchar *)0x0;
    anon_unknown.dwarf_4eb0f::WriteAttributeToMemory
              (&memory,"screenWindowCenter","v2f",(uchar *)header,8);
    header = (char  [4])(float)exrImage->width;
    anon_unknown.dwarf_4eb0f::WriteAttributeToMemory
              (&memory,"screenWindowWidth","float",(uchar *)header,4);
    if (0 < exrImage->num_custom_attributes) {
      puts("custom");
      data_00 = &exrImage->custom_attributes[0].value;
      for (lVar26 = 0; lVar26 < exrImage->num_custom_attributes; lVar26 = lVar26 + 1) {
        anon_unknown.dwarf_4eb0f::WriteAttributeToMemory
                  (&memory,((EXRAttribute *)(data_00 + -3))->name,(char *)data_00[-2],
                   (uchar *)data_00,*(int *)(data_00 + -1));
        data_00 = data_00 + 4;
      }
    }
    _header = _header & 0xffffffffffffff00;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&memory,(value_type *)header);
    iVar7 = exrImage->height / 0x10;
    uVar29 = (uint)(iVar7 * 0x10 < exrImage->height) + iVar7;
    __n = (size_type)(int)uVar29;
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&offsets,__n,(allocator_type *)header);
    puVar21 = memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish +
              (__n * 8 -
              (long)memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::vector(&dataList,__n,(allocator_type *)header);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&channelOffsetList,(long)exrImage->num_channels,(allocator_type *)header);
    uVar23 = 0;
    uVar39 = (ulong)(uint)exrImage->num_channels;
    if (exrImage->num_channels < 1) {
      uVar39 = uVar23;
    }
    uVar31 = 0;
    local_184 = 0;
    for (; uVar39 != uVar23; uVar23 = uVar23 + 1) {
      channelOffsetList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar23] = uVar31;
      uVar32 = (ulong)(uint)exrImage->requested_pixel_types[uVar23];
      if (2 < uVar32) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                      ,0x26f0,
                      "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                     );
      }
      local_184 = local_184 + *(int *)(&DAT_001a8138 + uVar32 * 4);
      uVar31 = uVar31 + *(long *)(&DAT_001a8120 + uVar32 * 8);
    }
    if ((int)uVar29 < 1) {
      uVar29 = 0;
    }
    iVar7 = 0;
    iVar25 = 0;
    uVar39 = 0;
    while (uVar39 != uVar29) {
      iVar24 = exrImage->height;
      iVar27 = (int)(uVar39 + 1);
      iVar8 = iVar27 * 0x10;
      if (SBORROW4(iVar24,iVar8) != iVar24 + iVar27 * -0x10 < 0) {
        iVar8 = iVar24;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&buf,(long)((iVar8 + (int)uVar39 * -0x10) * local_184 * exrImage->width),
                 (allocator_type *)header);
      if (iVar35 <= iVar24) {
        iVar24 = iVar35;
      }
      iVar8 = iVar24 + iVar25;
      if (iVar24 + iVar25 < 1) {
        iVar8 = 0;
      }
      for (lVar26 = 0; lVar26 < exrImage->num_channels; lVar26 = lVar26 + 1) {
        iVar24 = exrImage->pixel_types[lVar26];
        if (iVar24 == 2) {
          if (exrImage->requested_pixel_types[lVar26] == 1) {
            local_178 = iVar7;
            for (iVar24 = 0; iVar24 != iVar8; iVar24 = iVar24 + 1) {
              lVar10 = 0;
              while( true ) {
                lVar37 = (long)exrImage->width;
                if (lVar37 <= lVar10) break;
                uVar6 = *(uint *)(exrImage->images[lVar26] +
                                 (long)(local_178 * exrImage->width + (int)lVar10) * 4);
                uVar20 = uVar6 >> 0x17;
                uVar33 = uVar20 & 0xff;
                uVar22 = (ushort)uVar33;
                if ((char)uVar20 != '\0') {
                  if (uVar33 == 0xff) {
                    uVar22 = ((uVar6 & 0x7fffff) != 0 | 0x3e) << 9;
                  }
                  else {
                    uVar22 = 0x7c00;
                    if (uVar33 < 0x8f) {
                      if (uVar33 < 0x71) {
                        uVar22 = 0;
                        if (uVar33 < 0x66) goto LAB_00164480;
                        uVar30 = uVar6 & 0x7fffff | 0x800000;
                        uVar22 = (ushort)(uVar30 >> (0x7eU - (char)uVar20 & 0x1f));
                        uVar30 = uVar30 >> (0x7d - uVar33 & 0x1f);
                      }
                      else {
                        uVar22 = ((ushort)(uVar6 >> 0xd) & 0x3ff | (ushort)((uVar20 & 0x1f) << 10))
                                 ^ 0x4000;
                        uVar30 = uVar6 >> 0xc;
                      }
                      uVar22 = uVar22 + ((uVar30 & 1) != 0);
                    }
LAB_00164480:
                    uVar22 = uVar22 & 0x7fff;
                  }
                }
                pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                    (&buf,channelOffsetList.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar26] * lVar37
                                          + lVar37 * (iVar24 * local_184));
                *(ushort *)(pvVar12 + lVar10 * 2) = uVar22 | (ushort)(uVar6 >> 0x10) & 0x8000;
                lVar10 = lVar10 + 1;
              }
              local_178 = local_178 + 1;
            }
          }
          else {
            if (exrImage->requested_pixel_types[lVar26] != 2) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                            ,0x2755,
                            "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                           );
            }
            iVar24 = iVar7;
            for (iVar27 = 0; iVar27 != iVar8; iVar27 = iVar27 + 1) {
              lVar10 = 0;
              while( true ) {
                lVar37 = (long)exrImage->width;
                if (lVar37 <= lVar10) break;
                uVar5 = *(undefined4 *)
                         (exrImage->images[lVar26] +
                         (long)(iVar24 * exrImage->width + (int)lVar10) * 4);
                pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                    (&buf,channelOffsetList.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar26] * lVar37
                                          + lVar37 * (iVar27 * local_184));
                *(undefined4 *)(pvVar12 + lVar10 * 4) = uVar5;
                lVar10 = lVar10 + 1;
              }
              iVar24 = iVar24 + 1;
            }
          }
        }
        else if (iVar24 == 1) {
          if (exrImage->requested_pixel_types[lVar26] == 2) {
            iVar24 = iVar7;
            for (iVar27 = 0; iVar27 != iVar8; iVar27 = iVar27 + 1) {
              lVar10 = 0;
              while( true ) {
                lVar37 = (long)exrImage->width;
                if (lVar37 <= lVar10) break;
                uVar22 = *(ushort *)
                          (exrImage->images[lVar26] +
                          (long)(iVar24 * exrImage->width + (int)lVar10) * 2);
                pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                    (&buf,channelOffsetList.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar26] * lVar37
                                          + lVar37 * (iVar27 * local_184));
                h._2_2_ = 0;
                h.u = uVar22;
                FVar9 = anon_unknown.dwarf_4eb0f::half_to_float(h);
                *(FP32 *)(pvVar12 + lVar10 * 4) = FVar9;
                lVar10 = lVar10 + 1;
              }
              iVar24 = iVar24 + 1;
            }
          }
          else {
            if (exrImage->requested_pixel_types[lVar26] != 1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                            ,0x2728,
                            "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                           );
            }
            iVar24 = iVar7;
            for (iVar27 = 0; iVar27 != iVar8; iVar27 = iVar27 + 1) {
              lVar10 = 0;
              while( true ) {
                lVar37 = (long)exrImage->width;
                if (lVar37 <= lVar10) break;
                uVar4 = *(undefined2 *)
                         (exrImage->images[lVar26] +
                         (long)(iVar24 * exrImage->width + (int)lVar10) * 2);
                pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                    (&buf,channelOffsetList.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar26] * lVar37
                                          + lVar37 * (iVar27 * local_184));
                *(undefined2 *)(pvVar12 + lVar10 * 2) = uVar4;
                lVar10 = lVar10 + 1;
              }
              iVar24 = iVar24 + 1;
            }
          }
        }
        else if (iVar24 == 0) {
          iVar27 = iVar7;
          for (iVar24 = 0; iVar24 != iVar8; iVar24 = iVar24 + 1) {
            lVar10 = 0;
            while( true ) {
              lVar37 = (long)exrImage->width;
              if (lVar37 <= lVar10) break;
              uVar5 = *(undefined4 *)
                       (exrImage->images[lVar26] +
                       (long)(iVar27 * exrImage->width + (int)lVar10) * 4);
              pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                  (&buf,channelOffsetList.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar26] * lVar37 +
                                        lVar37 * (iVar24 * local_184));
              *(undefined4 *)(pvVar12 + lVar10 * 4) = uVar5;
              lVar10 = lVar10 + 1;
            }
            iVar27 = iVar27 + 1;
          }
        }
      }
      mVar13 = mz_compressBound((long)buf.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)buf.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&block,mVar13,(allocator_type *)header);
      pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&block,0);
      pvVar38 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&buf,0);
      mVar13 = (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,mVar13,
                 (allocator_type *)&local_f8);
      pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,0);
      pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,0);
      pvVar28 = pvVar38 + mVar13;
      lVar26 = 0;
      for (; pvVar38 < pvVar28; pvVar38 = pvVar38 + 2) {
        pvVar14[lVar26] = *pvVar38;
        if (pvVar28 <= pvVar38 + 1) break;
        pvVar15[lVar26 + (mVar13 + 1 >> 1)] = pvVar38[1];
        lVar26 = lVar26 + 1;
      }
      pvVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,0);
      pvVar38 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,0);
      vVar19 = *pvVar16;
      while (pvVar16 = pvVar16 + 1, pvVar16 < pvVar38 + mVar13) {
        vVar3 = *pvVar16;
        *pvVar16 = (vVar3 - vVar19) + 0x80;
        vVar19 = vVar3;
      }
      local_f8 = mz_compressBound(mVar13);
      pvVar38 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,0);
      iVar24 = mz_compress(pvVar12,&local_f8,pvVar38,mVar13);
      if (iVar24 != 0) {
        __assert_fail("ret == miniz::MZ_OK",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                      ,0x1bc6,
                      "void (anonymous namespace)::CompressZip(unsigned char *, unsigned long long &, const unsigned char *, unsigned long)"
                     );
      }
      uVar5 = (undefined4)local_f8;
      uVar23 = local_f8 & 0xffffffff;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)header);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,8,
                 (allocator_type *)&local_f8);
      piVar17 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,0)
      ;
      *piVar17 = (int)uVar39 * 0x10;
      pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)header,4);
      *(undefined4 *)pvVar12 = uVar5;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                 (dataList.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar39),
                 (const_iterator)
                 dataList.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar39].
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,_header,local_120);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                 (dataList.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar39),
                 (const_iterator)
                 dataList.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar39].
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar23));
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)header);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      iVar35 = iVar35 + 0x10;
      iVar25 = iVar25 + -0x10;
      iVar7 = iVar7 + 0x10;
      uVar39 = uVar39 + 1;
    }
    lVar26 = 1;
    for (uVar39 = 0;
        __position = memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish, uVar29 != uVar39;
        uVar39 = uVar39 + 1) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&data,
                 (const_iterator)
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )*(uchar **)
                    ((long)dataList.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -8),
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(&((dataList.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start)[lVar26]);
      offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar39] = (longlong)puVar21;
      puVar21 = puVar21 + ((long)(&((dataList.
                                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_start)[lVar26] -
                          *(long *)((long)dataList.
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                   lVar26 * 8 + -8));
      lVar26 = lVar26 + 3;
    }
    __first = std::vector<long_long,_std::allocator<long_long>_>::at(&offsets,0);
    pvVar18 = std::vector<long_long,_std::allocator<long_long>_>::at(&offsets,0);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&memory,
               (const_iterator)__position,(uchar *)__first,(uchar *)(pvVar18 + __n));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&memory,
               (const_iterator)
               memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    if ((long)memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start == 0) {
      __assert_fail("memory.size() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                    ,0x27a2,
                    "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                   );
    }
    __dest = (uchar *)malloc((long)memory.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)memory.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    *memory_out = __dest;
    pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&memory,0);
    __n_00 = (long)memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    memcpy(__dest,pvVar12,__n_00);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&channelOffsetList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
    ;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector(&dataList);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              (&offsets.super__Vector_base<long_long,_std::allocator<long_long>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  return __n_00;
}

Assistant:

size_t SaveMultiChannelEXRToMemory(const EXRImage *exrImage,
                                   unsigned char **memory_out,
                                   const char **err) {
  if (exrImage == NULL || memory_out == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  std::vector<unsigned char> memory;

  // Header
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};
    memory.insert(memory.end(), header, header + 4);
  }

  // Version, scanline.
  {
    const char marker[] = {2, 0, 0, 0};
    memory.insert(memory.end(), marker, marker + 4);
  }

  int numScanlineBlocks =
      16; // 1 for no compress & ZIPS, 16 for ZIP compression.

  // Write attributes.
  {
    std::vector<unsigned char> data;

    std::vector<ChannelInfo> channels;
    for (int c = 0; c < exrImage->num_channels; c++) {
      ChannelInfo info;
      info.pLinear = 0;
      info.pixelType = exrImage->requested_pixel_types[c];
      info.xSampling = 1;
      info.ySampling = 1;
      info.name = std::string(exrImage->channel_names[c]);
      channels.push_back(info);
    }

    WriteChannelInfo(data, channels);

    WriteAttributeToMemory(memory, "channels", "chlist", &data.at(0),
                           data.size()); // +1 = null
  }

  {
    int compressionType = 3; // ZIP compression
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&compressionType));
    }
    WriteAttributeToMemory(
        memory, "compression", "compression",
        reinterpret_cast<const unsigned char *>(&compressionType), 1);
  }

  {
    int data[4] = {0, 0, exrImage->width - 1, exrImage->height - 1};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&data[0]));
      swap4(reinterpret_cast<unsigned int *>(&data[1]));
      swap4(reinterpret_cast<unsigned int *>(&data[2]));
      swap4(reinterpret_cast<unsigned int *>(&data[3]));
    }
    WriteAttributeToMemory(memory, "dataWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
    WriteAttributeToMemory(memory, "displayWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
  }

  {
    unsigned char lineOrder = 0; // increasingY
    WriteAttributeToMemory(memory, "lineOrder", "lineOrder", &lineOrder, 1);
  }

  {
    float aspectRatio = 1.0f;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&aspectRatio));
    }
    WriteAttributeToMemory(
        memory, "pixelAspectRatio", "float",
        reinterpret_cast<const unsigned char *>(&aspectRatio), sizeof(float));
  }

  {
    float center[2] = {0.0f, 0.0f};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&center[0]));
      swap4(reinterpret_cast<unsigned int *>(&center[1]));
    }
    WriteAttributeToMemory(memory, "screenWindowCenter", "v2f",
                           reinterpret_cast<const unsigned char *>(center),
                           2 * sizeof(float));
  }

  {
    float w = (float)exrImage->width;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&w));
    }
    WriteAttributeToMemory(memory, "screenWindowWidth", "float",
                           reinterpret_cast<const unsigned char *>(&w),
                           sizeof(float));
  }

  // Custom attributes
  if (exrImage->num_custom_attributes > 0) {
    printf("custom\n");
    // @todo { endian }
    for (int i = 0; i < exrImage->num_custom_attributes; i++) {
      WriteAttributeToMemory(memory, exrImage->custom_attributes[i].name, exrImage->custom_attributes[i].type,
                             reinterpret_cast<const unsigned char *>(&exrImage->custom_attributes[i].value),
                             exrImage->custom_attributes[i].size);
        
    }
  }

  { // end of header
    unsigned char e = 0;
    memory.push_back(e);
  }

  int numBlocks = exrImage->height / numScanlineBlocks;
  if (numBlocks * numScanlineBlocks < exrImage->height) {
    numBlocks++;
  }

  std::vector<long long> offsets(numBlocks);

  size_t headerSize = memory.size();
  long long offset =
      headerSize +
      numBlocks * sizeof(long long); // sizeof(header) + sizeof(offsetTable)

  std::vector<unsigned char> data;

  bool isBigEndian = IsBigEndian();

  std::vector<std::vector<unsigned char> > dataList(numBlocks);
  std::vector<size_t> channelOffsetList(exrImage->num_channels);

  int pixelDataSize = 0;
  size_t channelOffset = 0;
  for (int c = 0; c < exrImage->num_channels; c++) {
    channelOffsetList[c] = channelOffset;
    if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
      pixelDataSize += sizeof(unsigned short);
      channelOffset += sizeof(unsigned short);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
      pixelDataSize += sizeof(float);
      channelOffset += sizeof(float);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {
      pixelDataSize += sizeof(unsigned int);
      channelOffset += sizeof(unsigned int);
    } else {
      assert(0);
    }
  }

#ifdef _OPENMP
#pragma omp parallel for
#endif
  for (int i = 0; i < numBlocks; i++) {
    int startY = numScanlineBlocks * i;
    int endY = (std::min)(numScanlineBlocks * (i + 1), exrImage->height);
    int h = endY - startY;

    std::vector<unsigned char> buf(exrImage->width * h * pixelDataSize);

    for (int c = 0; c < exrImage->num_channels; c++) {
      if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP16 h16;
              h16.u = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP32 f32 = half_to_float(h16);

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&f32.f));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = f32.f;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              unsigned short val = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap2(&val);
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }

      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP32 f32;
              f32.f = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP16 h16;
              h16 = float_to_half_full(f32);

              if (isBigEndian) {
                swap2(reinterpret_cast<unsigned short *>(&h16.u));
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = h16.u;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              float val = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&val));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }
      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {

        for (int y = 0; y < h; y++) {
          for (int x = 0; x < exrImage->width; x++) {
            unsigned int val = reinterpret_cast<unsigned int **>(
                exrImage->images)[c][(y + startY) * exrImage->width + x];

            if (isBigEndian) {
              swap4(&val);
            }

            // Assume increasing Y
            unsigned int *linePtr = reinterpret_cast<unsigned int *>(
                &buf.at(pixelDataSize * y * exrImage->width +
                        channelOffsetList[c] * exrImage->width));
            linePtr[x] = val;
          }
        }
      }
    }

    std::vector<unsigned char> block(miniz::mz_compressBound(buf.size()));
    unsigned long long outSize = block.size();

    CompressZip(&block.at(0), outSize,
                reinterpret_cast<const unsigned char *>(&buf.at(0)),
                buf.size());

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    std::vector<unsigned char> header(8);
    unsigned int dataLen = outSize; // truncate
    memcpy(&header.at(0), &startY, sizeof(int));
    memcpy(&header.at(4), &dataLen, sizeof(unsigned int));

    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&header.at(0)));
      swap4(reinterpret_cast<unsigned int *>(&header.at(4)));
    }

    dataList[i].insert(dataList[i].end(), header.begin(), header.end());
    dataList[i].insert(dataList[i].end(), block.begin(),
                       block.begin() + dataLen);

    // data.insert(data.end(), header.begin(), header.end());
    // data.insert(data.end(), block.begin(), block.begin() + dataLen);

    // offsets[i] = offset;
    // if (IsBigEndian()) {
    //  swap8(reinterpret_cast<unsigned long long*>(&offsets[i]));
    //}
    // offset += dataLen + 8; // 8 = sizeof(blockHeader)
  } // omp parallel

  for (int i = 0; i < numBlocks; i++) {

    data.insert(data.end(), dataList[i].begin(), dataList[i].end());

    offsets[i] = offset;
    if (IsBigEndian()) {
      swap8(reinterpret_cast<unsigned long long *>(&offsets[i]));
    }
    offset += dataList[i].size();
  }

  {
    memory.insert(memory.end(),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)) +
                      sizeof(unsigned long long) * numBlocks);
  }

  { memory.insert(memory.end(), data.begin(), data.end()); }

  assert(memory.size() > 0);

  (*memory_out) = (unsigned char *)malloc(memory.size());
  memcpy((*memory_out), &memory.at(0), memory.size());

  return memory.size(); // OK
}